

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_array_container_ixor
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  bool bVar1;
  uint64_t uVar2;
  array_container_t *paVar3;
  container_t **dst_local;
  array_container_t *src_2_local;
  bitset_container_t *src_1_local;
  
  *dst = src_1;
  uVar2 = bitset_flip_list_withcard
                    (src_1->words,(long)src_1->cardinality,src_2->array,(long)src_2->cardinality);
  src_1->cardinality = (int32_t)uVar2;
  bVar1 = 0x1000 < src_1->cardinality;
  if (!bVar1) {
    paVar3 = array_container_from_bitset(src_1);
    *dst = paVar3;
    bitset_container_free(src_1);
  }
  return bVar1;
}

Assistant:

bool bitset_array_container_ixor(
    bitset_container_t *src_1, const array_container_t *src_2,
    container_t **dst
){
    *dst = src_1;
    src_1->cardinality = (uint32_t)bitset_flip_list_withcard(
        src_1->words, src_1->cardinality, src_2->array, src_2->cardinality);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}